

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

size_t __thiscall Memory::HeapInfo::Rescan(HeapInfo *this,RescanFlags flags)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = 0x78;
  lVar4 = 0;
  do {
    uVar1 = HeapBucketGroup<SmallAllocationBlockAttributes>::Rescan
                      ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
                       ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->
                               recycler + lVar3),this->recycler,flags);
    lVar4 = lVar4 + (ulong)uVar1;
    lVar3 = lVar3 + 0x380;
  } while (lVar3 != 0xa878);
  lVar3 = 0xa878;
  do {
    uVar1 = HeapBucketGroup<MediumAllocationBlockAttributes>::Rescan
                      ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
                       ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->
                               recycler + lVar3),this->recycler,flags);
    lVar4 = lVar4 + (ulong)uVar1;
    lVar3 = lVar3 + 0x380;
  } while (lVar3 != 0x10df8);
  sVar2 = LargeHeapBucket::Rescan(&this->largeObjectBucket,flags);
  return sVar2 + lVar4;
}

Assistant:

size_t
HeapInfo::Rescan(RescanFlags flags)
{
    size_t scannedPageCount = 0;

    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        scannedPageCount += heapBuckets[i].Rescan(recycler, flags);
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
#if SMALLBLOCK_MEDIUM_ALLOC
        scannedPageCount += mediumHeapBuckets[i].Rescan(recycler, flags);
#else
        scannedPageCount += mediumHeapBuckets[i].Rescan(flags);
#endif
    }
#endif

    scannedPageCount += largeObjectBucket.Rescan(flags);

    return scannedPageCount;
}